

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-subfilter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  int z;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_filters;
  undefined8 local_158;
  Mat test_image_copy;
  Mat test_image;
  int local_e8;
  int local_e4;
  long local_e0;
  long *local_a8;
  Mat test_image_sized;
  
  cv::Mat::Mat(&test_image);
  local_158 = 0x1e000000280;
  cv::Mat::create(&test_image,&local_158,0x10);
  for (lVar9 = 0; lVar9 < local_e8; lVar9 = lVar9 + 1) {
    lVar7 = 2;
    for (lVar6 = 0; lVar6 < local_e4; lVar6 = lVar6 + 1) {
      lVar11 = *local_a8 * lVar9 + local_e0;
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      *(char *)(lVar7 + -2 + lVar11) = (char)(iVar2 % 0xff);
      *(char *)(lVar7 + -1 + lVar11) = (char)((long)iVar3 % 0xff);
      *(char *)(lVar7 + lVar11) = (char)(iVar4 % 0xff);
      lVar7 = lVar7 + 3;
    }
  }
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    cv::Mat::Mat(&test_image_sized);
    _test_image_copy = 0x1010000;
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(sub_filters.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&test_image_sized;
    cv::resize(0,0);
    ac::fill_filter_map();
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&ac::orig_frame,&test_image_copy);
    cv::Mat::~Mat(&test_image_copy);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&blend_image,&test_image_copy);
    cv::Mat::~Mat(&test_image_copy);
    LOCK();
    blend_set = 1;
    UNLOCK();
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sub_filters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buildFilters(&sub_filters);
    for (uVar8 = 0; uVar10 = (ulong)uVar8,
        uVar10 < (ulong)((long)sub_filters.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sub_filters.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Testing Filter: ");
      poVar5 = std::operator<<(poVar5,(string *)
                                      (sub_filters.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar10));
      std::operator<<(poVar5,"\n");
      iVar2 = 10;
      while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
        cv::Mat::clone();
        LOCK();
        ac::subfilter._0_4_ = 0;
        UNLOCK();
        ac::CallFilter((string *)
                       (sub_filters.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar10),&test_image_copy);
        cv::Mat::~Mat(&test_image_copy);
      }
      std::operator<<((ostream *)&std::cout,"Passed Test...\n");
      ac::release_all_objects();
      std::operator<<((ostream *)&std::cout,"Cleared Frames...\n");
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Passed ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," Image Filter Tests...\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sub_filters);
    cv::Mat::~Mat(&test_image_sized);
    cv::Mat::~Mat(&test_image);
    return 0;
  }
  std::operator<<((ostream *)&std::cerr,"Error image could not be loaded.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    cv::Mat test_image;
    test_image.create(cv::Size(640, 480), CV_8UC3);
    for(int z = 0; z < test_image.rows; ++z) {
        for(int i = 0; i < test_image.cols; ++i) {
            cv::Vec3b &pixel = test_image.at<cv::Vec3b>(z, i);
            pixel = cv::Vec3b(rand()%255, rand()%255, rand()%255);
        }
    }
    if(test_image.empty()) {
        std::cerr << "Error image could not be loaded.\n";
        exit(EXIT_FAILURE);
    }
    // setup test image
    cv::Mat test_image_sized;
    cv::resize(test_image, test_image_sized, cv::Size(640, 480));
    // initialize libacidcam
    ac::fill_filter_map();
    ac::orig_frame = test_image_sized.clone();
    blend_image = test_image_sized.clone();
    blend_set = true;
    // create vector of filters
    std::vector<std::string> sub_filters;
    // populate vector with image filters
    buildFilters(sub_filters);
    for(unsigned int i = 0; i < sub_filters.size(); ++i) {
        std::cout << "Testing Filter: " << sub_filters[i] << "\n";
        for(int j = 0; j < 10; ++j) {
            cv::Mat test_image_copy = test_image_sized.clone();
            ac::subfilter = 0;
            ac::CallFilter(sub_filters[i], test_image_copy);
        }
        std::cout << "Passed Test...\n";
        ac::release_all_objects();
        std::cout << "Cleared Frames...\n";
    }
    std::cout << "Passed " << sub_filters.size() << " Image Filter Tests...\n";
    return 0;
}